

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O3

QDir __thiscall QFileInfo::absoluteDir(QFileInfo *this)

{
  QFileInfo *in_RSI;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  absolutePath(&local_30,in_RSI);
  QDir::QDir((QDir *)this,&local_30);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QSharedDataPointer<QDirPrivate>)(QSharedDataPointer<QDirPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QDir QFileInfo::absoluteDir() const
{
    return QDir(absolutePath());
}